

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O1

void SequenceTask_DemoLDF::run(search *sch,multi_ex *ec)

{
  long *plVar1;
  long lVar2;
  ptag hi;
  bool bVar3;
  uint32_t uVar4;
  predictor *ppVar5;
  stringstream *psVar6;
  ostream *poVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  predictor P;
  char local_129;
  multi_ex *local_128;
  ulong local_120;
  predictor local_118;
  
  plVar1 = (long *)sch->task_data;
  Search::predictor::predictor(&local_118,sch,0);
  local_128 = ec;
  if ((ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar10 = 0;
    local_120 = 0;
    do {
      if (plVar1[1] != 0) {
        uVar9 = 1;
        uVar11 = 0;
        do {
          bVar3 = Search::search::predictNeedsExample(sch);
          if (bVar3) {
            VW::copy_example_data
                      (false,(example *)(*plVar1 + uVar11 * 0x68d0),
                       (local_128->super__Vector_base<example_*,_std::allocator<example_*>_>).
                       _M_impl.super__Vector_impl_data._M_start[uVar10]);
            my_update_example_indicies
                      (sch,false,(example *)(uVar11 * 0x68d0 + *plVar1),0x1b90d09,uVar11 * 0x49be95)
            ;
          }
          lVar2 = *plVar1;
          lVar8 = uVar11 * 0x68d0;
          **(undefined4 **)(lVar2 + 0x6828 + lVar8) = 0;
          *(uint *)(*(long *)(lVar2 + 0x6828 + lVar8) + 4) = uVar9;
          *(undefined4 *)(*(long *)(lVar2 + 0x6828 + lVar8) + 8) = 0;
          *(undefined4 *)(*(long *)(lVar2 + 0x6828 + lVar8) + 0xc) = 0;
          uVar11 = (ulong)uVar9;
          uVar9 = uVar9 + 1;
        } while (uVar11 < (ulong)plVar1[1]);
      }
      uVar4 = ((local_128->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar10]->l).multi.label;
      hi = (ptag)local_120;
      uVar9 = hi + 1;
      ppVar5 = Search::predictor::set_tag(&local_118,uVar9);
      ppVar5 = Search::predictor::set_input(ppVar5,(example *)*plVar1,plVar1[1]);
      ppVar5 = Search::predictor::set_oracle(ppVar5,uVar4 - 1);
      uVar4 = Search::search::get_history_length(sch);
      ppVar5 = Search::predictor::set_condition_range(ppVar5,hi,uVar4,'p');
      Search::predictor::predict(ppVar5);
      psVar6 = Search::search::output_abi_cxx11_(sch);
      if (*(int *)(psVar6 + *(long *)(*(long *)psVar6 + -0x18) + 0x20) == 0) {
        psVar6 = Search::search::output_abi_cxx11_(sch);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)(psVar6 + 0x10));
        local_129 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_129,1);
      }
      uVar10 = (ulong)uVar9;
      local_120 = (ulong)uVar9;
    } while (uVar10 < (ulong)((long)(local_128->
                                    super__Vector_base<example_*,_std::allocator<example_*>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_128->
                                    super__Vector_base<example_*,_std::allocator<example_*>_>).
                                    _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  Search::predictor::~predictor(&local_118);
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data* data = sch.get_task_data<task_data>();
  Search::predictor P(sch, (ptag)0);
  for (ptag i = 0; i < ec.size(); i++)
  {
    for (uint32_t a = 0; a < data->num_actions; a++)
    {
      if (sch.predictNeedsExample())  // we can skip this work if `predict` won't actually use the example data
      {
        VW::copy_example_data(false, &data->ldf_examples[a], ec[i]);  // copy but leave label alone!
        // now, offset it appropriately for the action id
        my_update_example_indicies(sch, true, &data->ldf_examples[a], 28904713, 4832917 * (uint64_t)a);
      }

      // regardless of whether the example is needed or not, the class info is needed
      CS::label& lab = data->ldf_examples[a].l.cs;
      // need to tell search what the action id is, so that it can add history features correctly!
      lab.costs[0].x = 0.;
      lab.costs[0].class_index = a + 1;
      lab.costs[0].partial_prediction = 0.;
      lab.costs[0].wap_value = 0.;
    }

    action oracle = ec[i]->l.multi.label - 1;
    action pred_id = P.set_tag((ptag)(i + 1))
                         .set_input(data->ldf_examples, data->num_actions)
                         .set_oracle(oracle)
                         .set_condition_range(i, sch.get_history_length(), 'p')
                         .predict();
    action prediction = pred_id + 1;  // or ldf_examples[pred_id]->ld.costs[0].weight_index

    if (sch.output().good())
      sch.output() << prediction << ' ';
  }
}